

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RamFileManager.cpp
# Opt level: O0

const_iterator * __thiscall
supermap::io::RamFileManager::getFileIterator(RamFileManager *this,path *file)

{
  bool bVar1;
  undefined8 uVar2;
  _Self *in_RDI;
  const_iterator *it;
  path *in_stack_ffffffffffffff48;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  path *in_stack_ffffffffffffffb0;
  RamFileManager *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  _Elt_pointer in_stack_ffffffffffffffc8;
  _Elt_pointer in_stack_ffffffffffffffd0;
  
  getFileIteratorNoThrow(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::
  deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>::
  end((deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>
       *)in_stack_ffffffffffffff48);
  bVar1 = std::operator==(in_RDI,(_Self *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  std::filesystem::__cxx11::path::operator_cast_to_string(in_stack_ffffffffffffff48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  FileException::FileException
            ((FileException *)in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->name,
             in_stack_ffffffffffffffc0);
  __cxa_throw(uVar2,&FileException::typeinfo,FileException::~FileException);
}

Assistant:

std::deque<RamFileManager::File>::const_iterator RamFileManager::getFileIterator(
    const std::filesystem::path &file) const {
    auto it = getFileIteratorNoThrow(file);
    if (it == files.end()) {
        throw FileException(file, "Not found");
    }
    return it;
}